

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridWavelet.cpp
# Opt level: O1

void __thiscall TasGrid::GridWavelet::updateAccelerationData(GridWavelet *this,ChangeType change)

{
  AlgorithmPreference AVar1;
  CudaWaveletData<double> *__ptr;
  CudaWaveletData<float> *__ptr_00;
  WaveletBasisMatrix local_e0;
  
  if (change == change_sparse_dense) {
    AVar1 = ((this->super_BaseCanonicalGrid).acceleration)->algorithm_select;
    if (AVar1 == algorithm_sparse) {
      if ((this->inter_matrix).num_rows < 1) {
        return;
      }
      if ((this->inter_matrix).dense.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start ==
          (this->inter_matrix).dense.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        return;
      }
    }
    else {
      if (AVar1 != algorithm_dense) {
        return;
      }
      if ((this->inter_matrix).num_rows < 1) {
        return;
      }
      if ((this->inter_matrix).dense.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start !=
          (this->inter_matrix).dense.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        return;
      }
    }
    local_e0.tol = 1e-12;
    local_e0.num_rows = 0;
    memset(&local_e0.pntr,0,200);
    TasSparse::WaveletBasisMatrix::operator=(&this->inter_matrix,&local_e0);
  }
  else {
    if (change != change_gpu_device) {
      return;
    }
    __ptr = (this->gpu_cache)._M_t.
            super___uniq_ptr_impl<TasGrid::CudaWaveletData<double>,_std::default_delete<TasGrid::CudaWaveletData<double>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_TasGrid::CudaWaveletData<double>_*,_std::default_delete<TasGrid::CudaWaveletData<double>_>_>
            .super__Head_base<0UL,_TasGrid::CudaWaveletData<double>_*,_false>._M_head_impl;
    (this->gpu_cache)._M_t.
    super___uniq_ptr_impl<TasGrid::CudaWaveletData<double>,_std::default_delete<TasGrid::CudaWaveletData<double>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_TasGrid::CudaWaveletData<double>_*,_std::default_delete<TasGrid::CudaWaveletData<double>_>_>
    .super__Head_base<0UL,_TasGrid::CudaWaveletData<double>_*,_false>._M_head_impl =
         (CudaWaveletData<double> *)0x0;
    if (__ptr != (CudaWaveletData<double> *)0x0) {
      ::std::default_delete<TasGrid::CudaWaveletData<double>_>::operator()
                ((default_delete<TasGrid::CudaWaveletData<double>_> *)&this->gpu_cache,__ptr);
    }
    __ptr_00 = (this->gpu_cachef)._M_t.
               super___uniq_ptr_impl<TasGrid::CudaWaveletData<float>,_std::default_delete<TasGrid::CudaWaveletData<float>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_TasGrid::CudaWaveletData<float>_*,_std::default_delete<TasGrid::CudaWaveletData<float>_>_>
               .super__Head_base<0UL,_TasGrid::CudaWaveletData<float>_*,_false>._M_head_impl;
    (this->gpu_cachef)._M_t.
    super___uniq_ptr_impl<TasGrid::CudaWaveletData<float>,_std::default_delete<TasGrid::CudaWaveletData<float>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_TasGrid::CudaWaveletData<float>_*,_std::default_delete<TasGrid::CudaWaveletData<float>_>_>
    .super__Head_base<0UL,_TasGrid::CudaWaveletData<float>_*,_false>._M_head_impl =
         (CudaWaveletData<float> *)0x0;
    if (__ptr_00 != (CudaWaveletData<float> *)0x0) {
      ::std::default_delete<TasGrid::CudaWaveletData<float>_>::operator()
                ((default_delete<TasGrid::CudaWaveletData<float>_> *)&this->gpu_cachef,__ptr_00);
    }
    if ((this->inter_matrix).num_rows < 1) {
      return;
    }
    local_e0.tol = 1e-12;
    local_e0.num_rows = 0;
    memset(&local_e0.pntr,0,200);
    TasSparse::WaveletBasisMatrix::operator=(&this->inter_matrix,&local_e0);
  }
  TasSparse::WaveletBasisMatrix::~WaveletBasisMatrix(&local_e0);
  return;
}

Assistant:

void GridWavelet::updateAccelerationData(AccelerationContext::ChangeType change) const{
    switch(change){
        case AccelerationContext::change_gpu_device:
            gpu_cache.reset();
            gpu_cachef.reset();
            if (inter_matrix.getNumRows() > 0)
                inter_matrix = TasSparse::WaveletBasisMatrix();
            break;
        case AccelerationContext::change_sparse_dense:
            if ((acceleration->algorithm_select == AccelerationContext::algorithm_dense and inter_matrix.isSparse())
                or (acceleration->algorithm_select == AccelerationContext::algorithm_sparse and inter_matrix.isDense()))
                inter_matrix = TasSparse::WaveletBasisMatrix();
            break;
        default:
            break;
    }
}